

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkexmlParser.cpp
# Opt level: O0

shared_ptr<Node> __thiscall SkexmlParser::MakeNode(SkexmlParser *this,string *name,ifstream *file)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Node> sVar6;
  bool local_28b;
  bool local_28a;
  byte local_26f;
  bool local_26a;
  string local_248 [32];
  shared_ptr<Node> local_228;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [8];
  string value;
  unsigned_long value_end;
  unsigned_long value_begin;
  string attribute_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  byte local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  undefined4 local_b0;
  byte local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [39];
  allocator local_81;
  string local_80 [8];
  string input;
  allocator local_49;
  string local_48 [8];
  string child_name;
  ifstream *file_local;
  string *name_local;
  shared_ptr<Node> *node;
  
  std::make_shared<Node,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)file,local_80);
  Utils::RemoveEndline((string *)local_80);
LAB_002009f1:
  bVar1 = std::ios::eof();
  if (((bVar1 ^ 0xff) & 1) != 0) {
    uVar3 = std::__cxx11::string::length();
    local_a9 = 0;
    local_26a = false;
    if (1 < uVar3) {
      std::__cxx11::string::substr((ulong)local_a8,(ulong)local_80);
      local_a9 = 1;
      local_26a = std::operator==(local_a8,"[/");
    }
    if ((local_a9 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_a8);
    }
    if (local_26a == false) {
      std::__cxx11::string::substr((ulong)local_d0,(ulong)local_80);
      bVar2 = std::operator!=(local_d0,"[");
      std::__cxx11::string::~string((string *)local_d0);
      if (bVar2) {
        do {
          uVar3 = std::__cxx11::string::length();
          local_f1 = 0;
          if (uVar3 < 2) {
LAB_00200bf6:
            local_26f = std::ios::eof();
            local_26f = local_26f ^ 0xff;
          }
          else {
            std::__cxx11::string::substr((ulong)local_f0,(ulong)local_80);
            local_f1 = 1;
            bVar2 = std::operator!=(local_f0,"[/");
            local_26f = 0;
            if (bVar2) goto LAB_00200bf6;
          }
          if ((local_f1 & 1) != 0) {
            std::__cxx11::string::~string((string *)local_f0);
          }
          if ((local_26f & 1) == 0) goto LAB_00200d9a;
          peVar5 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                              )this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_118,"List",&local_119);
          std::__cxx11::string::string(local_140,local_80);
          Node::AddListAttribute(peVar5,(string *)local_118,(string *)local_140);
          std::__cxx11::string::~string(local_140);
          std::__cxx11::string::~string(local_118);
          std::allocator<char>::~allocator((allocator<char> *)&local_119);
          std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)file,local_80);
          Utils::RemoveEndline((string *)local_80);
        } while( true );
      }
      lVar4 = std::__cxx11::string::length();
      uVar3 = std::__cxx11::string::find((char *)local_80,0x23c06b);
      if (uVar3 < lVar4 - 1U) {
        std::__cxx11::string::find((char *)local_80,0x23c06b);
        std::__cxx11::string::substr((ulong)&value_begin,(ulong)local_80);
        std::__cxx11::string::find((char *)local_80,0x23c06b);
        std::__cxx11::string::find((char *)local_80,0x23c06d);
        std::__cxx11::string::substr((ulong)local_1b8,(ulong)local_80);
        peVar5 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            this);
        std::__cxx11::string::string(local_1d8,(string *)&value_begin);
        std::__cxx11::string::string(local_1f8,local_1b8);
        Node::AddAttribute(peVar5,(string *)local_1d8,(string *)local_1f8);
        std::__cxx11::string::~string(local_1f8);
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::string::~string(local_1b8);
        std::__cxx11::string::~string((string *)&value_begin);
      }
      else {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_218,(ulong)local_80);
        std::__cxx11::string::operator=(local_48,local_218);
        std::__cxx11::string::~string(local_218);
        peVar5 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            this);
        std::__cxx11::string::string(local_248,local_48);
        MakeNode((SkexmlParser *)&local_228,(string *)local_248,file);
        Node::AddChild(peVar5,&local_228);
        std::shared_ptr<Node>::~shared_ptr(&local_228);
        std::__cxx11::string::~string(local_248);
      }
      goto LAB_0020119b;
    }
  }
LAB_002011ca:
  local_b0 = 1;
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  sVar6.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar6.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Node>)sVar6.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
LAB_00200d9a:
  bVar2 = false;
  bVar1 = std::ios::eof();
  local_28a = true;
  if ((bVar1 & 1) == 0) {
    uVar3 = std::__cxx11::string::length();
    local_28b = false;
    bVar2 = 1 < uVar3;
    if (bVar2) {
      std::__cxx11::string::substr((ulong)local_160,(ulong)local_80);
      local_28b = std::operator==(local_160,"[/");
    }
    local_28a = local_28b;
  }
  if (bVar2) {
    std::__cxx11::string::~string((string *)local_160);
  }
  if (local_28a != false) goto LAB_002011ca;
LAB_0020119b:
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)file,local_80);
  Utils::RemoveEndline((string *)local_80);
  goto LAB_002009f1;
}

Assistant:

std::shared_ptr<Node> SkexmlParser::MakeNode(std::string name, std::ifstream& file) {
    std::shared_ptr<Node> node = std::make_shared<Node>(name);
    std::string child_name = "";
    std::string input = "";
    std::getline(file, input);
    Utils::RemoveEndline(input);
    while(!file.eof())
    {
        if(input.length() > 1 and input.substr(0,2) == "[/")
            return node;
        else if(input.substr(0,1) != "[") {
            while((input.length() < 2 or input.substr(0,2) != "[/") and !file.eof())
            {
                node->AddListAttribute("List", input);
                std::getline(file, input);
                Utils::RemoveEndline(input);
            }
            if(file.eof() or (input.length() > 1 and input.substr(0,2) == "[/"))
                return node;
        }
        else if(input.length() - 1 > input.find("]")) {
            std::string attribute_name = input.substr(1, input.find("]") - 1);
            unsigned long value_begin = input.find("]") + 1;
            unsigned long value_end = input.find("[/") - value_begin;
            std::string value = input.substr(value_begin, value_end);
            node->AddAttribute(attribute_name, value);
        }
        else {
            child_name = input.substr(1, input.length() - 2);
            node->AddChild(MakeNode(child_name, file));
        }
        std::getline(file, input);
        Utils::RemoveEndline(input);
    }
    return node;
}